

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O2

void __thiscall QMetaStringTable::QMetaStringTable(QMetaStringTable *this,QByteArray *className)

{
  (this->m_entries).d = (Data *)0x0;
  this->m_index = 0;
  QArrayDataPointer<char>::QArrayDataPointer(&(this->m_className).d,&className->d);
  enter(this,&this->m_className);
  return;
}

Assistant:

QMetaStringTable::QMetaStringTable(const QByteArray &className)
    : m_index(0)
    , m_className(className)
{
    const int index = enter(m_className);
    Q_ASSERT(index == 0);
    Q_UNUSED(index);
}